

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_block_tests.cpp
# Opt level: O2

shared_ptr<const_CBlock> __thiscall
validation_block_tests::MinerTestingSetup::GoodBlock(MinerTestingSetup *this,uint256 *prev_hash)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_FS_OFFSET;
  shared_ptr<CBlock> pblock;
  shared_ptr<const_CBlock> sVar2;
  undefined1 auStack_48 [16];
  __uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_> local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  _Head_base<0UL,_ECC_Context_*,_false> local_20;
  
  local_20._M_head_impl =
       *(ECC_Context **)
        &((__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_> *)(in_FS_OFFSET + 0x28))
         ->_M_t;
  Block((MinerTestingSetup *)auStack_48,prev_hash);
  pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_48;
  pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)prev_hash;
  FinalizeBlock((MinerTestingSetup *)&local_38,pblock);
  _Var1._M_pi = a_Stack_30[0]._M_pi;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(tuple<kernel::Context_*,_std::default_delete<kernel::Context>_> *)
   &(this->super_RegTestingSetup).super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup
    .m_interrupt =
       local_38._M_t.
       super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
       super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &(this->super_RegTestingSetup).super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup
    .m_interrupt.m_pipe_w = _Var1._M_pi;
  local_38._M_t.super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
  super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl =
       (tuple<kernel::Context_*,_std::default_delete<kernel::Context>_>)
       (_Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_48 + 8));
  if (*(SignalInterrupt **)(in_FS_OFFSET + 0x28) == (SignalInterrupt *)local_20._M_head_impl) {
    sVar2.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar2.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
    ;
    return (shared_ptr<const_CBlock>)
           sVar2.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<const CBlock> MinerTestingSetup::GoodBlock(const uint256& prev_hash)
{
    return FinalizeBlock(Block(prev_hash));
}